

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

void relu(pBox *pbox,mydataFmt *pbias)

{
  int iVar1;
  float *pfVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  float fVar8;
  
  pfVar2 = pbox->pdata;
  if (pfVar2 == (float *)0x0) {
    pcVar6 = "the  Relu feature is NULL!!";
  }
  else {
    if (pbias != (mydataFmt *)0x0) {
      iVar4 = pbox->height * pbox->width;
      iVar7 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      iVar5 = pbox->channel;
      if (pbox->channel < 1) {
        iVar5 = 0;
      }
      for (; iVar1 = iVar4, iVar7 != iVar5; iVar7 = iVar7 + 1) {
        while (iVar1 != 0) {
          fVar8 = *pfVar2 + *pbias;
          *pfVar2 = (float)(~-(uint)(0.0 < fVar8) & (uint)(fVar8 * 0.0) |
                           (uint)fVar8 & -(uint)(0.0 < fVar8));
          pfVar2 = pfVar2 + 1;
          iVar1 = iVar1 + -1;
        }
        pbias = pbias + 1;
      }
      return;
    }
    pcVar6 = "the  Relu bias is NULL!!";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void relu(struct pBox *pbox, mydataFmt *pbias) {
    if (pbox->pdata == NULL) {
        cout << "the  Relu feature is NULL!!" << endl;
        return;
    }
    if (pbias == NULL) {
        cout << "the  Relu bias is NULL!!" << endl;
        return;
    }
    mydataFmt *op = pbox->pdata;
    mydataFmt *pb = pbias;

    long dis = pbox->width * pbox->height;
    for (int channel = 0; channel < pbox->channel; channel++) {
        for (int col = 0; col < dis; col++) {
            *op = *op + *pb;
            *op = (*op > 0) ? (*op) : ((*op) * 0);
            op++;
        }
        pb++;
    }
}